

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

int fmt::v6::internal::
    parse_nonnegative_int<char,fmt::v6::internal::specs_checker<fmt::v6::internal::specs_handler<fmt::v6::basic_format_parse_context<char,fmt::v6::internal::error_handler>,fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>>&>
              (char **begin,char *end,
              specs_checker<fmt::v6::internal::specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>_>
              *eh)

{
  long in_RSI;
  long *in_RDI;
  uint big;
  uint max_int;
  uint value;
  uint in_stack_ffffffffffffffd8;
  uint uVar1;
  uint uVar2;
  
  uVar2 = 0;
  do {
    if (0xccccccc < uVar2) {
      uVar2 = 0x80000000;
      uVar1 = in_stack_ffffffffffffffd8;
      break;
    }
    uVar2 = uVar2 * 10 + *(char *)*in_RDI + -0x30;
    *in_RDI = *in_RDI + 1;
    uVar1 = in_stack_ffffffffffffffd8 & 0xffffff;
    if ((*in_RDI != in_RSI) &&
       (uVar1 = in_stack_ffffffffffffffd8 & 0xffffff, '/' < *(char *)*in_RDI)) {
      uVar1 = CONCAT13(*(char *)*in_RDI < ':',(int3)in_stack_ffffffffffffffd8);
    }
    in_stack_ffffffffffffffd8 = uVar1;
  } while ((char)(uVar1 >> 0x18) != '\0');
  if (0x7fffffff < uVar2) {
    specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
    ::on_error((specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
                *)CONCAT44(uVar2,0x7fffffff),(char *)CONCAT44(0xccccccc,uVar1));
  }
  return uVar2;
}

Assistant:

FMT_CONSTEXPR int parse_nonnegative_int(const Char*& begin, const Char* end,
                                        ErrorHandler&& eh) {
  FMT_ASSERT(begin != end && '0' <= *begin && *begin <= '9', "");
  unsigned value = 0;
  // Convert to unsigned to prevent a warning.
  constexpr unsigned max_int = max_value<int>();
  unsigned big = max_int / 10;
  do {
    // Check for overflow.
    if (value > big) {
      value = max_int + 1;
      break;
    }
    value = value * 10 + unsigned(*begin - '0');
    ++begin;
  } while (begin != end && '0' <= *begin && *begin <= '9');
  if (value > max_int) eh.on_error("number is too big");
  return static_cast<int>(value);
}